

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::sdiv(APInt *this,int64_t RHS)

{
  bool bVar1;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  APInt AVar3;
  APInt local_80;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  APInt local_30;
  long local_20;
  int64_t RHS_local;
  APInt *this_local;
  undefined8 uVar2;
  
  local_20 = in_RDX;
  RHS_local = RHS;
  this_local = this;
  bVar1 = isNegative((APInt *)RHS);
  if (bVar1) {
    if (local_20 < 0) {
      APInt(&local_40,(APInt *)RHS);
      llvm::operator-((llvm *)&local_30,&local_40);
      udiv(this,(uint64_t)&local_30);
      ~APInt(&local_30);
      ~APInt(&local_40);
      uVar2 = extraout_RDX;
    }
    else {
      APInt(&local_70,(APInt *)RHS);
      llvm::operator-((llvm *)&local_60,&local_70);
      udiv(&local_50,(uint64_t)&local_60);
      llvm::operator-((llvm *)this,&local_50);
      ~APInt(&local_50);
      ~APInt(&local_60);
      ~APInt(&local_70);
      uVar2 = extraout_RDX_00;
    }
  }
  else if (local_20 < 0) {
    udiv(&local_80,RHS);
    llvm::operator-((llvm *)this,&local_80);
    ~APInt(&local_80);
    uVar2 = extraout_RDX_01;
  }
  else {
    AVar3 = udiv(this,RHS);
    uVar2 = AVar3._8_8_;
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::sdiv(int64_t RHS) const {
  if (isNegative()) {
    if (RHS < 0)
      return (-(*this)).udiv(-RHS);
    return -((-(*this)).udiv(RHS));
  }
  if (RHS < 0)
    return -(this->udiv(-RHS));
  return this->udiv(RHS);
}